

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreMaterial.cpp
# Opt level: O2

bool __thiscall
Assimp::Ogre::OgreImporter::ReadTextureUnit
          (OgreImporter *this,string *textureUnitName,stringstream *ss,aiMaterial *material)

{
  uint index;
  bool bVar1;
  bool bVar2;
  __type _Var3;
  Logger *pLVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  mapped_type *pmVar8;
  aiString *this_00;
  size_t __n;
  aiTextureType textureType;
  int uvCoord;
  string identifier;
  string partTexture;
  string textureRef;
  string linePart;
  char *local_4f8 [4];
  string partColorOp;
  string partTextCoordSet;
  string local_498;
  string local_478;
  aiString assimpTextureRef;
  string local_50;
  
  linePart._M_dataplus._M_p = (pointer)&linePart.field_2;
  linePart._M_string_length = 0;
  linePart.field_2._M_local_buf[0] = '\0';
  std::operator>>((istream *)ss,(string *)&linePart);
  bVar1 = std::operator!=(&linePart,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          partBlockStart_abi_cxx11_);
  if (bVar1) {
    pLVar4 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[63]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &assimpTextureRef,
               (char (*) [63])"Invalid material: Texture unit block start missing near index ");
    std::istream::tellg();
    std::ostream::_M_insert<long>((long)&assimpTextureRef);
    std::__cxx11::stringbuf::str();
    Logger::error(pLVar4,partTexture._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&partTexture);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&assimpTextureRef);
    bVar1 = false;
    goto LAB_00442061;
  }
  pLVar4 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[18]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &assimpTextureRef,(char (*) [18])"   texture_unit \'");
  std::operator<<((ostream *)&assimpTextureRef,(string *)textureUnitName);
  std::operator<<((ostream *)&assimpTextureRef,"\'");
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar4,partTexture._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&partTexture);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&assimpTextureRef);
  std::__cxx11::string::string((string *)&partTexture,"texture",(allocator *)&assimpTextureRef);
  std::__cxx11::string::string
            ((string *)&partTextCoordSet,"tex_coord_set",(allocator *)&assimpTextureRef);
  std::__cxx11::string::string((string *)&partColorOp,"colour_op",(allocator *)&assimpTextureRef);
  textureType = aiTextureType_NONE;
  textureRef._M_dataplus._M_p = (pointer)&textureRef.field_2;
  textureRef._M_string_length = 0;
  textureRef.field_2._M_local_buf[0] = '\0';
  uvCoord = 0;
  bVar1 = true;
  while( true ) {
    bVar2 = std::operator!=(&linePart,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            partBlockEnd_abi_cxx11_);
    if (!bVar2) break;
    std::operator>>((istream *)ss,(string *)&linePart);
    _Var3 = std::operator==(&linePart,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            partComment_abi_cxx11_);
    if (_Var3) {
      SkipLine(&local_50,ss);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      _Var3 = std::operator==(&linePart,&partTexture);
      if (_Var3) {
        std::operator>>((istream *)ss,(string *)&linePart);
        std::__cxx11::string::_M_assign((string *)&textureRef);
        if (this->m_detectTextureTypeFromFilename == true) {
          uVar5 = std::__cxx11::string::find_last_of((char *)&textureRef,0x5a5d1e);
          uVar6 = std::__cxx11::string::find_last_of((char *)&textureRef,0x59eb1a);
          if (uVar6 < uVar5 && uVar5 != 0xffffffffffffffff) {
            std::__cxx11::string::substr((ulong)&local_478,(ulong)&textureRef);
            ToLower(&identifier,&local_478);
            std::__cxx11::string::~string((string *)&local_478);
            pLVar4 = DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[47]>
                      ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &assimpTextureRef,
                       (char (*) [47])"Detecting texture type from filename postfix \'");
            std::operator<<((ostream *)&assimpTextureRef,(string *)&identifier);
            std::operator<<((ostream *)&assimpTextureRef,"\'");
            std::__cxx11::stringbuf::str();
            Logger::debug(pLVar4,local_4f8[0]);
            std::__cxx11::string::~string((string *)local_4f8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&assimpTextureRef);
            bVar1 = std::operator==(&identifier,"_n");
            if (bVar1) {
LAB_00441c1e:
              textureType = aiTextureType_NORMALS;
            }
            else {
              bVar1 = std::operator==(&identifier,"_nrm");
              if (bVar1) goto LAB_00441c1e;
              bVar1 = std::operator==(&identifier,"_nrml");
              if (bVar1) goto LAB_00441c1e;
              bVar1 = std::operator==(&identifier,"_normal");
              if (bVar1) goto LAB_00441c1e;
              bVar1 = std::operator==(&identifier,"_normals");
              if (bVar1) goto LAB_00441c1e;
              bVar1 = std::operator==(&identifier,"_normalmap");
              if (bVar1) goto LAB_00441c1e;
              bVar1 = std::operator==(&identifier,"_s");
              if (bVar1) {
LAB_00441d6a:
                textureType = aiTextureType_SPECULAR;
              }
              else {
                bVar1 = std::operator==(&identifier,"_spec");
                if (bVar1) goto LAB_00441d6a;
                bVar1 = std::operator==(&identifier,"_specular");
                if (bVar1) goto LAB_00441d6a;
                bVar1 = std::operator==(&identifier,"_specularmap");
                if (bVar1) goto LAB_00441d6a;
                bVar1 = std::operator==(&identifier,"_l");
                if (bVar1) {
LAB_00441dde:
                  textureType = aiTextureType_LIGHTMAP;
                }
                else {
                  bVar1 = std::operator==(&identifier,"_light");
                  if (bVar1) goto LAB_00441dde;
                  bVar1 = std::operator==(&identifier,"_lightmap");
                  if (bVar1) goto LAB_00441dde;
                  bVar1 = std::operator==(&identifier,"_occ");
                  if (bVar1) goto LAB_00441dde;
                  bVar1 = std::operator==(&identifier,"_occlusion");
                  if (bVar1) goto LAB_00441dde;
                  bVar1 = std::operator==(&identifier,"_disp");
                  if (bVar1) {
LAB_00441e15:
                    textureType = aiTextureType_DISPLACEMENT;
                  }
                  else {
                    bVar1 = std::operator==(&identifier,"_displacement");
                    if (bVar1) goto LAB_00441e15;
                    textureType = aiTextureType_DIFFUSE;
                  }
                }
              }
            }
            this_00 = (aiString *)&identifier;
            goto LAB_00441d11;
          }
          textureType = aiTextureType_DIFFUSE;
          bVar1 = false;
        }
        else {
          std::__cxx11::string::string((string *)&local_498,(string *)textureUnitName);
          ToLower((string *)&assimpTextureRef,&local_498);
          std::__cxx11::string::~string((string *)&local_498);
          lVar7 = std::__cxx11::string::find((char *)&assimpTextureRef,0x5b1307);
          if (lVar7 == -1) {
            lVar7 = std::__cxx11::string::find((char *)&assimpTextureRef,0x5b14be);
            if (lVar7 == -1) {
              lVar7 = std::__cxx11::string::find((char *)&assimpTextureRef,0x5b14ce);
              if (lVar7 == -1) {
                lVar7 = std::__cxx11::string::find((char *)&assimpTextureRef,0x5b14f5);
                if (lVar7 == -1) {
                  textureType = aiTextureType_DIFFUSE;
                }
                else {
                  textureType = aiTextureType_DISPLACEMENT;
                }
              }
              else {
                textureType = aiTextureType_LIGHTMAP;
              }
            }
            else {
              textureType = aiTextureType_SPECULAR;
            }
          }
          else {
            textureType = aiTextureType_NORMALS;
          }
          this_00 = &assimpTextureRef;
LAB_00441d11:
          std::__cxx11::string::~string((string *)this_00);
          bVar1 = false;
        }
      }
      else {
        _Var3 = std::operator==(&linePart,&partTextCoordSet);
        if (_Var3) {
          std::istream::operator>>(ss,&uvCoord);
        }
        else {
          std::operator==(&linePart,&partColorOp);
        }
      }
    }
  }
  if (textureRef._M_string_length == 0) {
    pLVar4 = DefaultLogger::get();
    Logger::warn(pLVar4,"Texture reference is empty, ignoring texture_unit.");
LAB_00441eb1:
    bVar1 = false;
  }
  else {
    if (bVar1) {
      pLVar4 = DefaultLogger::get();
      std::operator+(&identifier,"Failed to detect texture type for \'",&textureRef);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &assimpTextureRef,&identifier,"\', ignoring texture_unit.");
      Logger::warn(pLVar4,(char *)CONCAT44(assimpTextureRef.data._0_4_,assimpTextureRef.length));
      std::__cxx11::string::~string((string *)&assimpTextureRef);
      std::__cxx11::string::~string((string *)&identifier);
      goto LAB_00441eb1;
    }
    pmVar8 = std::
             map<aiTextureType,_unsigned_int,_std::less<aiTextureType>,_std::allocator<std::pair<const_aiTextureType,_unsigned_int>_>_>
             ::operator[](&this->m_textures,&textureType);
    index = *pmVar8;
    pmVar8 = std::
             map<aiTextureType,_unsigned_int,_std::less<aiTextureType>,_std::allocator<std::pair<const_aiTextureType,_unsigned_int>_>_>
             ::operator[](&this->m_textures,&textureType);
    *pmVar8 = *pmVar8 + 1;
    pLVar4 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[14]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &assimpTextureRef,(char (*) [14])"    texture \'");
    std::operator<<((ostream *)&assimpTextureRef,(string *)&textureRef);
    std::operator<<((ostream *)&assimpTextureRef,"\' type ");
    std::ostream::operator<<(&assimpTextureRef,textureType);
    std::operator<<((ostream *)&assimpTextureRef," index ");
    std::ostream::_M_insert<unsigned_long>((ulong)&assimpTextureRef);
    std::operator<<((ostream *)&assimpTextureRef," UV ");
    std::ostream::operator<<(&assimpTextureRef,uvCoord);
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar4,identifier._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&identifier);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&assimpTextureRef);
    __n = 0x3ff;
    if ((textureRef._M_string_length & 0xfffffc00) == 0) {
      __n = textureRef._M_string_length & 0xffffffff;
    }
    assimpTextureRef.length = (ai_uint32)__n;
    memcpy(assimpTextureRef.data,textureRef._M_dataplus._M_p,__n);
    assimpTextureRef.data[__n] = '\0';
    aiMaterial::AddProperty(material,&assimpTextureRef,"$tex.file",textureType,index);
    aiMaterial::AddProperty(material,&uvCoord,1,"$tex.uvwsrc",textureType,index);
    bVar1 = true;
  }
  std::__cxx11::string::~string((string *)&textureRef);
  std::__cxx11::string::~string((string *)&partColorOp);
  std::__cxx11::string::~string((string *)&partTextCoordSet);
  std::__cxx11::string::~string((string *)&partTexture);
LAB_00442061:
  std::__cxx11::string::~string((string *)&linePart);
  return bVar1;
}

Assistant:

bool OgreImporter::ReadTextureUnit(const std::string &textureUnitName, stringstream &ss, aiMaterial *material)
{
    string linePart;
    ss >> linePart;

    if (linePart != partBlockStart)
    {
        ASSIMP_LOG_ERROR_F( "Invalid material: Texture unit block start missing near index ", ss.tellg());
        return false;
    }

    ASSIMP_LOG_DEBUG_F("   texture_unit '", textureUnitName, "'");

    const string partTexture      = "texture";
    const string partTextCoordSet = "tex_coord_set";
    const string partColorOp      = "colour_op";

    aiTextureType textureType = aiTextureType_NONE;
    std::string textureRef;
    int uvCoord = 0;

    while(linePart != partBlockEnd)
    {
        ss >> linePart;

        // Skip commented lines
        if (linePart == partComment)
        {
            SkipLine(ss);
            continue;
        }

        if (linePart == partTexture)
        {
            ss >> linePart;
            textureRef = linePart;

            // User defined Assimp config property to detect texture type from filename.
            if (m_detectTextureTypeFromFilename)
            {
                size_t posSuffix = textureRef.find_last_of(".");
                size_t posUnderscore = textureRef.find_last_of("_");

                if (posSuffix != string::npos && posUnderscore != string::npos && posSuffix > posUnderscore)
                {
                    string identifier = Ogre::ToLower(textureRef.substr(posUnderscore, posSuffix - posUnderscore));
                    ASSIMP_LOG_DEBUG_F( "Detecting texture type from filename postfix '", identifier, "'");

                    if (identifier == "_n" || identifier == "_nrm" || identifier == "_nrml" || identifier == "_normal" || identifier == "_normals" || identifier == "_normalmap")
                    {
                        textureType = aiTextureType_NORMALS;
                    }
                    else if (identifier == "_s" || identifier == "_spec" || identifier == "_specular" || identifier == "_specularmap")
                    {
                        textureType = aiTextureType_SPECULAR;
                    }
                    else if (identifier == "_l" || identifier == "_light" || identifier == "_lightmap" || identifier == "_occ" || identifier == "_occlusion")
                    {
                        textureType = aiTextureType_LIGHTMAP;
                    }
                    else if (identifier == "_disp" || identifier == "_displacement")
                    {
                        textureType = aiTextureType_DISPLACEMENT;
                    }
                    else
                    {
                        textureType = aiTextureType_DIFFUSE;
                    }
                }
                else
                {
                    textureType = aiTextureType_DIFFUSE;
                }
            }
            // Detect from texture unit name. This cannot be too broad as
            // authors might give names like "LightSaber" or "NormalNinja".
            else
            {
                string unitNameLower = Ogre::ToLower(textureUnitName);
                if (unitNameLower.find("normalmap") != string::npos)
                {
                    textureType = aiTextureType_NORMALS;
                }
                else if (unitNameLower.find("specularmap") != string::npos)
                {
                    textureType = aiTextureType_SPECULAR;
                }
                else if (unitNameLower.find("lightmap") != string::npos)
                {
                    textureType = aiTextureType_LIGHTMAP;
                }
                else if (unitNameLower.find("displacementmap") != string::npos)
                {
                    textureType = aiTextureType_DISPLACEMENT;
                }
                else
                {
                    textureType = aiTextureType_DIFFUSE;
                }
            }
        }
        else if (linePart == partTextCoordSet)
        {
            ss >> uvCoord;
        }
        /// @todo Implement
        else if(linePart == partColorOp)
        {
            /*
            ss >> linePart;
            if("replace"==linePart)//I don't think, assimp has something for this...
            {
            }
            else if("modulate"==linePart)
            {
                //TODO: set value
                //material->AddProperty(aiTextureOp_Multiply)
            }
            */
        }
    }

    if (textureRef.empty())
    {
        ASSIMP_LOG_WARN("Texture reference is empty, ignoring texture_unit.");
        return false;
    }
    if (textureType == aiTextureType_NONE)
    {
        ASSIMP_LOG_WARN("Failed to detect texture type for '" + textureRef  + "', ignoring texture_unit.");
        return false;
    }

    unsigned int textureTypeIndex = m_textures[textureType];
    m_textures[textureType]++;

    ASSIMP_LOG_DEBUG_F( "    texture '", textureRef, "' type ", textureType,
        " index ", textureTypeIndex, " UV ", uvCoord);

    aiString assimpTextureRef(textureRef);
    material->AddProperty(&assimpTextureRef, AI_MATKEY_TEXTURE(textureType, textureTypeIndex));
    material->AddProperty(&uvCoord, 1, AI_MATKEY_UVWSRC(textureType, textureTypeIndex));

    return true;
}